

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3.c
# Opt level: O2

void blake3_hasher_finalize(blake3_hasher *self,uint8_t *out,size_t out_len)

{
  uint8_t uVar1;
  ulong uVar2;
  ulong uVar3;
  blake3_hasher *pbVar4;
  uint8_t *puVar5;
  size_t sVar6;
  uint64_t output_block_counter;
  uint64_t uVar7;
  bool bVar8;
  output_t output;
  uint32_t local_98 [2];
  uint32_t auStack_90 [2];
  uint32_t auStack_88 [2];
  uint32_t auStack_80 [2];
  uint8_t parent_block [64];
  
  uVar2 = (ulong)self->cv_stack_len;
  if (uVar2 == 0) {
    output.input_cv._0_8_ = *(undefined8 *)(self->chunk).cv;
    output.input_cv._8_8_ = *(undefined8 *)((self->chunk).cv + 2);
    output.input_cv._16_8_ = *(undefined8 *)((self->chunk).cv + 4);
    output.input_cv._24_8_ = *(undefined8 *)((self->chunk).cv + 6);
    output.block_len = (self->chunk).buf_len;
    output.counter = (self->chunk).chunk_counter;
    output.block._0_8_ = *(undefined8 *)(self->chunk).buf;
    output.block._8_8_ = *(undefined8 *)((self->chunk).buf + 8);
    output.block._16_8_ = *(undefined8 *)((self->chunk).buf + 0x10);
    output.block._24_8_ = *(undefined8 *)((self->chunk).buf + 0x18);
    output.block._32_8_ = *(undefined8 *)((self->chunk).buf + 0x20);
    output.block._40_8_ = *(undefined8 *)((self->chunk).buf + 0x28);
    output.block._48_8_ = *(undefined8 *)((self->chunk).buf + 0x30);
    output.block._56_8_ = *(undefined8 *)((self->chunk).buf + 0x38);
    uVar7 = 0;
    output.flags = (self->chunk).blocks_compressed == '\0' | (self->chunk).flags | 2;
    for (; out_len != 0; out_len = out_len - sVar6) {
      blake3_compress_xof(output.input_cv,output.block,output.block_len,uVar7,output.flags | 8,
                          parent_block);
      sVar6 = 0x40;
      if (out_len < 0x40) {
        sVar6 = out_len;
      }
      memcpy(out,parent_block,sVar6);
      out = out + sVar6;
      uVar7 = uVar7 + 1;
    }
  }
  else {
    uVar1 = (self->chunk).blocks_compressed;
    output.block_len = (self->chunk).buf_len;
    if (uVar1 == '\0' && output.block_len == '\0') {
      uVar3 = uVar2 - 2;
      output.block_len = '@';
      output.counter = 0;
      puVar5 = (self->chunk).buf + uVar2 * 0x20 + 9;
      output.flags = (self->chunk).flags | 4;
      pbVar4 = self;
    }
    else {
      output.counter = (self->chunk).chunk_counter;
      puVar5 = (self->chunk).buf;
      output.flags = uVar1 == '\0' | (self->chunk).flags | 2;
      uVar3 = uVar2;
      pbVar4 = (blake3_hasher *)&self->chunk;
    }
    output.input_cv._0_8_ = *(undefined8 *)pbVar4->key;
    output.input_cv._8_8_ = *(undefined8 *)(pbVar4->key + 2);
    output.input_cv._16_8_ = *(undefined8 *)(pbVar4->key + 4);
    output.input_cv._24_8_ = *(undefined8 *)(pbVar4->key + 6);
    output.block._0_8_ = *(undefined8 *)puVar5;
    output.block._8_8_ = *(undefined8 *)(puVar5 + 8);
    output.block._16_8_ = *(undefined8 *)(puVar5 + 0x10);
    output.block._24_8_ = *(undefined8 *)(puVar5 + 0x18);
    output.block._32_8_ = *(undefined8 *)(puVar5 + 0x20);
    output.block._40_8_ = *(undefined8 *)(puVar5 + 0x28);
    output.block._48_8_ = *(undefined8 *)(puVar5 + 0x30);
    output.block._56_8_ = *(undefined8 *)(puVar5 + 0x38);
    puVar5 = self->cv_stack + uVar3 * 0x20 + -0x20;
    while (bVar8 = uVar3 != 0, uVar3 = uVar3 - 1, bVar8) {
      parent_block._0_8_ = *(undefined8 *)puVar5;
      parent_block._8_8_ = *(undefined8 *)(puVar5 + 8);
      parent_block._16_8_ = *(undefined8 *)(puVar5 + 0x10);
      parent_block._24_8_ = *(undefined8 *)(puVar5 + 0x18);
      local_98[0] = output.input_cv[0];
      local_98[1] = output.input_cv[1];
      auStack_90[0] = output.input_cv[2];
      auStack_90[1] = output.input_cv[3];
      auStack_88[0] = output.input_cv[4];
      auStack_88[1] = output.input_cv[5];
      auStack_80[0] = output.input_cv[6];
      auStack_80[1] = output.input_cv[7];
      blake3_compress_in_place(local_98,output.block,output.block_len,output.counter,output.flags);
      parent_block._32_4_ = local_98[0];
      parent_block._36_4_ = local_98[1];
      parent_block._40_4_ = auStack_90[0];
      parent_block._44_4_ = auStack_90[1];
      parent_block._48_4_ = auStack_88[0];
      parent_block._52_4_ = auStack_88[1];
      parent_block._56_4_ = auStack_80[0];
      parent_block._60_4_ = auStack_80[1];
      puVar5 = puVar5 + -0x20;
      output.input_cv._0_8_ = *(undefined8 *)self->key;
      output.input_cv._8_8_ = *(undefined8 *)(self->key + 2);
      output.input_cv._16_8_ = *(undefined8 *)(self->key + 4);
      output.input_cv._24_8_ = *(undefined8 *)(self->key + 6);
      output.flags = (self->chunk).flags | 4;
      output.block[0] = parent_block[0];
      output.block[1] = parent_block[1];
      output.block[2] = parent_block[2];
      output.block[3] = parent_block[3];
      output.block[4] = parent_block[4];
      output.block[5] = parent_block[5];
      output.block[6] = parent_block[6];
      output.block[7] = parent_block[7];
      output.block[8] = parent_block[8];
      output.block[9] = parent_block[9];
      output.block[10] = parent_block[10];
      output.block[0xb] = parent_block[0xb];
      output.block[0xc] = parent_block[0xc];
      output.block[0xd] = parent_block[0xd];
      output.block[0xe] = parent_block[0xe];
      output.block[0xf] = parent_block[0xf];
      output.block[0x10] = parent_block[0x10];
      output.block[0x11] = parent_block[0x11];
      output.block[0x12] = parent_block[0x12];
      output.block[0x13] = parent_block[0x13];
      output.block[0x14] = parent_block[0x14];
      output.block[0x15] = parent_block[0x15];
      output.block[0x16] = parent_block[0x16];
      output.block[0x17] = parent_block[0x17];
      output.block[0x18] = parent_block[0x18];
      output.block[0x19] = parent_block[0x19];
      output.block[0x1a] = parent_block[0x1a];
      output.block[0x1b] = parent_block[0x1b];
      output.block[0x1c] = parent_block[0x1c];
      output.block[0x1d] = parent_block[0x1d];
      output.block[0x1e] = parent_block[0x1e];
      output.block[0x1f] = parent_block[0x1f];
      output.block._32_8_ = local_98;
      output.block._40_8_ = auStack_90;
      output.block._48_8_ = auStack_88;
      output.block._56_8_ = auStack_80;
      output.counter = 0;
      output.block_len = '@';
    }
    uVar7 = 0;
    for (; out_len != 0; out_len = out_len - sVar6) {
      blake3_compress_xof(output.input_cv,output.block,output.block_len,uVar7,output.flags | 8,
                          parent_block);
      sVar6 = 0x40;
      if (out_len < 0x40) {
        sVar6 = out_len;
      }
      memcpy(out,parent_block,sVar6);
      out = out + sVar6;
      uVar7 = uVar7 + 1;
    }
  }
  return;
}

Assistant:

void blake3_hasher_finalize(const blake3_hasher *self, uint8_t *out,
                            size_t out_len) {
  // If the subtree stack is empty, then the current chunk is the root.
  if (self->cv_stack_len == 0) {
    output_t output = chunk_state_output(&self->chunk);
    output_root_bytes(&output, out, out_len);
    return;
  }
  // If there are any bytes in the chunk state, finalize that chunk and do a
  // roll-up merge between that chunk hash and every subtree in the stack. In
  // this case, the extra merge loop at the end of blake3_hasher_update
  // guarantees that none of the subtrees in the stack need to be merged with
  // each other first. Otherwise, if there are no bytes in the chunk state,
  // then the top of the stack is a chunk hash, and we start the merge from
  // that.
  output_t output;
  size_t cvs_remaining;
  if (chunk_state_len(&self->chunk) > 0) {
    cvs_remaining = self->cv_stack_len;
    output = chunk_state_output(&self->chunk);
  } else {
    // There are always at least 2 CVs in the stack in this case.
    cvs_remaining = self->cv_stack_len - 2;
    output = parent_output(&self->cv_stack[cvs_remaining * 32], self->key,
                           self->chunk.flags);
  }
  while (cvs_remaining > 0) {
    cvs_remaining -= 1;
    uint8_t parent_block[BLAKE3_BLOCK_LEN];
    memcpy(parent_block, &self->cv_stack[cvs_remaining * 32], 32);
    output_chaining_value(&output, &parent_block[32]);
    output = parent_output(parent_block, self->key, self->chunk.flags);
  }
  output_root_bytes(&output, out, out_len);
}